

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O0

ActionResult * __thiscall
Shell::doAction(ActionResult *__return_storage_ptr__,Shell *this,Action *act)

{
  bool bVar1;
  __shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  pointer ppVar3;
  ModuleRunnerBase<wasm::ModuleRunner> *pMVar4;
  Name *local_198;
  Name *local_180;
  TrapException *anon_var_0_3;
  Literals local_138;
  shared_ptr<wasm::ModuleRunner> *local_100;
  shared_ptr<wasm::ModuleRunner> *instance_1;
  _Self local_f0;
  _Self local_e8;
  iterator it_1;
  type *get;
  TrapException *anon_var_0;
  HostLimitException *anon_var_0_1;
  WasmException *anon_var_0_2;
  Literals local_80;
  shared_ptr<wasm::ModuleRunner> *local_48;
  shared_ptr<wasm::ModuleRunner> *instance;
  _Self local_38;
  _Self local_30;
  iterator it;
  type *invoke;
  Action *act_local;
  Shell *this_local;
  
  this_00 = &std::
             map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
             ::operator[](&this->instances,&this->lastModule)->
             super___shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2>;
  peVar2 = std::__shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
  if (peVar2 == (element_type *)0x0) {
    __assert_fail("instances[lastModule].get()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp"
                  ,0xd1,"ActionResult Shell::doAction(Action &)");
  }
  it._M_node = (_Base_ptr)
               std::
               get_if<wasm::WATParser::InvokeAction,wasm::WATParser::InvokeAction,wasm::WATParser::GetAction>
                         (act);
  if ((add_pointer_t<wasm::WATParser::InvokeAction>)it._M_node ==
      (add_pointer_t<wasm::WATParser::InvokeAction>)0x0) {
    it_1._M_node = (_Base_ptr)
                   std::
                   get_if<wasm::WATParser::GetAction,wasm::WATParser::InvokeAction,wasm::WATParser::GetAction>
                             (act);
    if ((add_pointer_t<wasm::WATParser::GetAction>)it_1._M_node ==
        (add_pointer_t<wasm::WATParser::GetAction>)0x0) {
      ::wasm::handle_unreachable
                ("unexpected action",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp"
                 ,0xf1);
    }
    bVar1 = std::optional::operator_cast_to_bool((optional *)it_1._M_node);
    if (bVar1) {
      local_198 = std::optional<wasm::Name>::operator*((optional<wasm::Name> *)it_1._M_node);
    }
    else {
      local_198 = &this->lastModule;
    }
    local_e8._M_node =
         (_Base_ptr)
         std::
         map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
         ::find(&this->instances,local_198);
    local_f0._M_node =
         (_Base_ptr)
         std::
         map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
         ::end(&this->instances);
    bVar1 = std::operator==(&local_e8,&local_f0);
    if (bVar1) {
      std::variant<wasm::Literals,Shell::TrapResult,Shell::HostLimitResult,Shell::ExceptionResult>::
      variant<Shell::TrapResult,void,void,Shell::TrapResult,void>
                ((variant<wasm::Literals,Shell::TrapResult,Shell::HostLimitResult,Shell::ExceptionResult>
                  *)__return_storage_ptr__,(TrapResult *)((long)&instance_1 + 7));
    }
    else {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>
               ::operator->(&local_e8);
      local_100 = &ppVar3->second;
      pMVar4 = &std::
                __shared_ptr_access<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_100)->super_ModuleRunnerBase<wasm::ModuleRunner>;
      ::wasm::ModuleRunnerBase<wasm::ModuleRunner>::getExport
                (&local_138,pMVar4,(IString)*(IString *)&(it_1._M_node)->_M_right);
      std::variant<wasm::Literals,Shell::TrapResult,Shell::HostLimitResult,Shell::ExceptionResult>::
      variant<wasm::Literals,void,void,wasm::Literals,void>
                ((variant<wasm::Literals,Shell::TrapResult,Shell::HostLimitResult,Shell::ExceptionResult>
                  *)__return_storage_ptr__,&local_138);
      ::wasm::Literals::~Literals(&local_138);
    }
  }
  else {
    bVar1 = std::optional::operator_cast_to_bool((optional *)it._M_node);
    if (bVar1) {
      local_180 = std::optional<wasm::Name>::operator*((optional<wasm::Name> *)it._M_node);
    }
    else {
      local_180 = &this->lastModule;
    }
    local_30._M_node =
         (_Base_ptr)
         std::
         map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
         ::find(&this->instances,local_180);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
         ::end(&this->instances);
    bVar1 = std::operator==(&local_30,&local_38);
    if (bVar1) {
      std::variant<wasm::Literals,Shell::TrapResult,Shell::HostLimitResult,Shell::ExceptionResult>::
      variant<Shell::TrapResult,void,void,Shell::TrapResult,void>
                ((variant<wasm::Literals,Shell::TrapResult,Shell::HostLimitResult,Shell::ExceptionResult>
                  *)__return_storage_ptr__,(TrapResult *)((long)&instance + 7));
    }
    else {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>
               ::operator->(&local_30);
      local_48 = &ppVar3->second;
      pMVar4 = &std::
                __shared_ptr_access<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_48)->super_ModuleRunnerBase<wasm::ModuleRunner>;
      ::wasm::ModuleRunnerBase<wasm::ModuleRunner>::callExport
                (&local_80,pMVar4,(IString)*(IString *)&(it._M_node)->_M_right,
                 (Literals *)&it._M_node[1]._M_parent);
      std::variant<wasm::Literals,Shell::TrapResult,Shell::HostLimitResult,Shell::ExceptionResult>::
      variant<wasm::Literals,void,void,wasm::Literals,void>
                ((variant<wasm::Literals,Shell::TrapResult,Shell::HostLimitResult,Shell::ExceptionResult>
                  *)__return_storage_ptr__,&local_80);
      ::wasm::Literals::~Literals(&local_80);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ActionResult doAction(Action& act) {
    assert(instances[lastModule].get());
    if (auto* invoke = std::get_if<InvokeAction>(&act)) {
      auto it = instances.find(invoke->base ? *invoke->base : lastModule);
      if (it == instances.end()) {
        return TrapResult{};
      }
      auto& instance = it->second;
      try {
        return instance->callExport(invoke->name, invoke->args);
      } catch (TrapException&) {
        return TrapResult{};
      } catch (HostLimitException&) {
        return HostLimitResult{};
      } catch (WasmException&) {
        return ExceptionResult{};
      } catch (...) {
        WASM_UNREACHABLE("unexpected error");
      }
    } else if (auto* get = std::get_if<GetAction>(&act)) {
      auto it = instances.find(get->base ? *get->base : lastModule);
      if (it == instances.end()) {
        return TrapResult{};
      }
      auto& instance = it->second;
      try {
        return instance->getExport(get->name);
      } catch (TrapException&) {
        return TrapResult{};
      } catch (...) {
        WASM_UNREACHABLE("unexpected error");
      }
    } else {
      WASM_UNREACHABLE("unexpected action");
    }
  }